

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry.c
# Opt level: O1

char * archive_entry_copy_fflags_text(archive_entry *entry,char *flags)

{
  byte bVar1;
  byte *pbVar2;
  byte *pbVar3;
  
  archive_mstring_copy_mbs(&entry->ae_fflags_text,flags);
  do {
    bVar1 = *flags;
    if (bVar1 < 0x20) {
      if (bVar1 != 9) {
        if (bVar1 == 0) {
          pbVar2 = (byte *)0x0;
          goto LAB_00141ddc;
        }
LAB_00141d8f:
        pbVar2 = (byte *)0x0;
        pbVar3 = (byte *)flags;
        do {
          while ((0x2c < (ulong)(byte)*flags ||
                 ((0x100100000201U >> ((ulong)(byte)*flags & 0x3f) & 1) == 0))) {
            flags = (char *)((byte *)flags + 1);
          }
          while( true ) {
            bVar1 = *flags;
            if ((0x2c < (ulong)bVar1) || ((0x100100000200U >> ((ulong)bVar1 & 0x3f) & 1) == 0))
            break;
            flags = (char *)((byte *)flags + 1);
          }
          if (pbVar2 == (byte *)0x0) {
            pbVar2 = pbVar3;
          }
          pbVar3 = (byte *)flags;
        } while (bVar1 != 0);
LAB_00141ddc:
        entry->ae_fflags_set = 0;
        entry->ae_fflags_clear = 0;
        return (char *)pbVar2;
      }
    }
    else if ((bVar1 != 0x20) && (bVar1 != 0x2c)) goto LAB_00141d8f;
    flags = (char *)((byte *)flags + 1);
  } while( true );
}

Assistant:

const char *
archive_entry_copy_fflags_text(struct archive_entry *entry,
    const char *flags)
{
	archive_mstring_copy_mbs(&entry->ae_fflags_text, flags);
	return (ae_strtofflags(flags,
		    &entry->ae_fflags_set, &entry->ae_fflags_clear));
}